

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_row_template_push_variable(nk_context *ctx,float min_width)

{
  int iVar1;
  nk_panel *pnVar2;
  nk_panel *layout;
  nk_window *win;
  float min_width_local;
  nk_context *ctx_local;
  
  if ((((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
      (ctx->current->layout != (nk_panel *)0x0)) &&
     ((pnVar2 = ctx->current->layout, (pnVar2->row).type == NK_LAYOUT_TEMPLATE &&
      ((pnVar2->row).columns < 0x10)))) {
    iVar1 = (pnVar2->row).columns;
    (pnVar2->row).columns = iVar1 + 1;
    (pnVar2->row).templates[iVar1] = -min_width;
  }
  return;
}

Assistant:

NK_API void
nk_layout_row_template_push_variable(struct nk_context *ctx, float min_width)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
NK_ASSERT(layout->row.type == NK_LAYOUT_TEMPLATE);
NK_ASSERT(layout->row.columns < NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS);
if (layout->row.type != NK_LAYOUT_TEMPLATE) return;
if (layout->row.columns >= NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS) return;
layout->row.templates[layout->row.columns++] = -min_width;
}